

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

Parser * Catch::makeCommandLineParser(Parser *__return_storage_ptr__,ConfigData *config)

{
  Parser *__return_storage_ptr___00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer p_Var2;
  undefined8 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  allocator<char> local_2bf2;
  allocator<char> local_2bf1;
  allocator<char> local_2bf0;
  allocator<char> local_2bef;
  allocator<char> local_2bee;
  allocator<char> local_2bed;
  allocator<char> local_2bec;
  allocator<char> local_2beb;
  allocator<char> local_2bea;
  allocator<char> local_2be9;
  allocator<char> local_2be8;
  allocator<char> local_2be7;
  allocator<char> local_2be6;
  allocator<char> local_2be5;
  allocator<char> local_2be4;
  allocator<char> local_2be3;
  allocator<char> local_2be2;
  allocator<char> local_2be1;
  allocator<char> local_2be0;
  allocator<char> local_2bdf;
  allocator<char> local_2bde;
  allocator<char> local_2bdd;
  allocator<char> local_2bdc;
  allocator<char> local_2bdb;
  allocator<char> local_2bda;
  allocator<char> local_2bd9;
  allocator<char> local_2bd8;
  allocator<char> local_2bd7;
  allocator<char> local_2bd6;
  allocator<char> local_2bd5;
  allocator<char> local_2bd4;
  allocator<char> local_2bd3;
  allocator<char> local_2bd2;
  allocator<char> local_2bd1;
  allocator<char> local_2bd0;
  allocator<char> local_2bcf;
  allocator<char> local_2bce;
  allocator<char> local_2bcd;
  allocator<char> local_2bcc;
  allocator<char> local_2bcb;
  allocator<char> local_2bca;
  allocator<char> local_2bc9;
  allocator<char> local_2bc8;
  allocator<char> local_2bc7;
  allocator<char> local_2bc6;
  allocator<char> local_2bc5;
  allocator<char> local_2bc4;
  allocator<char> local_2bc3;
  allocator<char> local_2bc2;
  allocator<char> local_2bc1;
  allocator<char> local_2bc0;
  allocator<char> local_2bbf;
  allocator<char> local_2bbe;
  allocator<char> local_2bbd;
  allocator<char> local_2bbc;
  allocator<char> local_2bbb;
  allocator<char> local_2bba;
  allocator<char> local_2bb9;
  allocator<char> local_2bb8;
  allocator<char> local_2bb7;
  allocator<char> local_2bb6;
  allocator<char> local_2bb5;
  allocator<char> local_2bb4;
  allocator<char> local_2bb3;
  allocator<char> local_2bb2;
  allocator<char> local_2bb1;
  allocator<char> local_2bb0;
  allocator<char> local_2baf;
  allocator<char> local_2bae;
  allocator<char> local_2bad;
  allocator<char> local_2bac;
  allocator<char> local_2bab;
  allocator<char> local_2baa;
  allocator<char> local_2ba9;
  allocator<char> local_2ba8;
  allocator<char> local_2ba7;
  allocator<char> local_2ba6;
  allocator<char> local_2ba5;
  allocator<char> local_2ba4;
  allocator<char> local_2ba3;
  allocator<char> local_2ba2;
  allocator<char> local_2ba1;
  allocator<char> local_2ba0;
  allocator<char> local_2b9f;
  allocator<char> local_2b9e;
  allocator<char> local_2b9d;
  allocator<char> local_2b9c;
  allocator<char> local_2b9b;
  allocator<char> local_2b9a;
  allocator<char> local_2b99;
  allocator<char> local_2b98;
  allocator<char> local_2b97;
  allocator<char> local_2b96;
  allocator<char> local_2b95;
  allocator<char> local_2b94;
  allocator<char> local_2b93;
  allocator<char> local_2b92;
  allocator<char> local_2b91;
  allocator<char> local_2b90;
  allocator<char> local_2b8f;
  allocator<char> local_2b8e;
  allocator<char> local_2b8d;
  allocator<char> local_2b8c;
  allocator<char> local_2b8b;
  allocator<char> local_2b8a;
  allocator<char> local_2b89;
  Parser *local_2b88;
  __allocator_type __a2_12;
  string local_2b60 [32];
  string local_2b40;
  string local_2b20 [32];
  value_type local_2b00;
  string local_2ae0 [32];
  string local_2ac0 [32];
  string local_2aa0 [32];
  value_type local_2a80;
  string local_2a60 [32];
  string local_2a40 [32];
  value_type local_2a20;
  string local_2a00;
  string local_29e0 [32];
  value_type local_29c0;
  string local_29a0 [32];
  value_type local_2980;
  string local_2960;
  string local_2940 [32];
  value_type local_2920;
  string local_2900;
  string local_28e0 [32];
  value_type local_28c0;
  string local_28a0;
  string local_2880 [32];
  value_type local_2860;
  string local_2840 [32];
  value_type local_2820;
  string local_2800 [32];
  string local_27e0 [32];
  value_type local_27c0;
  string local_27a0 [32];
  value_type local_2780;
  string local_2760 [32];
  string local_2740 [32];
  value_type local_2720;
  string local_2700 [32];
  string local_26e0 [32];
  value_type local_26c0;
  string local_26a0 [32];
  string local_2680 [32];
  value_type local_2660;
  string local_2640 [32];
  value_type local_2620;
  string local_2600 [32];
  value_type local_25e0;
  string local_25c0 [32];
  value_type local_25a0;
  string local_2580 [32];
  value_type local_2560;
  value_type local_2540;
  string local_2520 [32];
  string local_2500 [32];
  value_type local_24e0;
  value_type local_24c0;
  string local_24a0;
  string local_2480 [32];
  value_type local_2460;
  value_type local_2440;
  string local_2420 [32];
  value_type local_2400;
  value_type local_23e0;
  string local_23c0 [32];
  string local_23a0 [32];
  value_type local_2380;
  value_type local_2360;
  string local_2340;
  string local_2320 [32];
  value_type local_2300;
  value_type local_22e0;
  string local_22c0 [32];
  string local_22a0 [32];
  value_type local_2280;
  value_type local_2260;
  string local_2240 [32];
  string local_2220 [32];
  value_type local_2200;
  value_type local_21e0;
  string local_21c0 [32];
  string local_21a0 [32];
  value_type local_2180;
  value_type local_2160;
  string local_2140 [32];
  value_type local_2120;
  value_type local_2100;
  string local_20e0;
  string local_20c0 [32];
  value_type local_20a0;
  value_type local_2080;
  string local_2060 [32];
  string local_2040 [32];
  value_type local_2020;
  value_type local_2000;
  string local_1fe0;
  string local_1fc0 [32];
  value_type local_1fa0;
  value_type local_1f80;
  string local_1f60 [32];
  value_type local_1f40;
  value_type local_1f20;
  string local_1f00 [32];
  value_type local_1ee0;
  value_type local_1ec0;
  string local_1ea0 [32];
  value_type local_1e80;
  value_type local_1e60;
  __allocator_type __a2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e28;
  string local_1e20 [32];
  _Alloc_hider local_1e00;
  size_type local_1df8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1df0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1de0;
  __allocator_type __a2_1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1dc0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1db8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1db0;
  string local_1da8 [32];
  _Alloc_hider local_1d88;
  size_type local_1d80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d68;
  __allocator_type __a2_8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1d48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1d40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d38;
  string local_1d30 [32];
  _Alloc_hider local_1d10;
  size_type local_1d08;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1cf0;
  undefined1 local_1cd8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1cd0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1cc8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1cc0;
  string local_1cb8 [32];
  _Alloc_hider local_1c98;
  size_type local_1c90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c78;
  __allocator_type __a2_3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1c58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c48;
  string local_1c40 [32];
  _Alloc_hider local_1c20;
  size_type local_1c18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c00;
  undefined1 local_1be8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1be0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1bd8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1bd0;
  string local_1bc8 [32];
  _Alloc_hider local_1ba8;
  size_type local_1ba0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1b88;
  ExeName local_1b70;
  undefined1 local_1b48 [8];
  pointer local_1b40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1b38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b30;
  string local_1b28 [32];
  _Alloc_hider local_1b08;
  size_type local_1b00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1af8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1ae8;
  undefined1 local_1ad0 [8];
  pointer local_1ac8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1ac0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1ab8;
  string local_1ab0 [32];
  _Alloc_hider local_1a90;
  size_type local_1a88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a70;
  __allocator_type __a2_5;
  string local_1a38 [32];
  _Alloc_hider local_1a18;
  size_type local_1a10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_19f8;
  undefined1 local_19e0 [64];
  _Alloc_hider local_19a0;
  size_type local_1998;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1990;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1980;
  undefined1 local_1968 [64];
  _Alloc_hider local_1928;
  size_type local_1920;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1918;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1908;
  undefined1 local_18f0 [64];
  _Alloc_hider local_18b0;
  size_type local_18a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_18a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1890;
  __allocator_type __a2_7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1870 [7];
  string local_1838 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1818;
  __allocator_type __a2_2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_17f8 [7];
  string local_17c0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_17a0;
  __allocator_type __a2_11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1780 [7];
  string local_1748 [32];
  undefined1 local_1728 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1720 [7];
  string local_16e8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_16c8;
  __allocator_type __a2_9;
  string local_1670 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1650;
  __allocator_type __a2_4;
  string local_15f8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_15d8;
  __allocator_type __a2_10;
  string local_1580 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1560;
  undefined1 local_1548 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1540 [7];
  string local_1508 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_14e8;
  __allocator_type __a2_6;
  string local_1490 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1470;
  undefined1 local_1458 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1450 [7];
  string local_1418 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_13f8;
  undefined1 local_13e0 [64];
  string local_13a0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1380;
  undefined1 local_1368 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1360 [7];
  string local_1328 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1308;
  undefined1 local_12f0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_12e8 [7];
  string local_12b0 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1290;
  undefined1 local_1278 [64];
  string local_1238 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1218;
  undefined1 local_1200 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_11a0;
  undefined1 local_1188 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1128;
  undefined1 local_1110 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_10b0;
  undefined1 local_1098 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1038;
  undefined1 local_1020 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_fc0;
  undefined1 local_fa8 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f48;
  undefined1 local_f30 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_ed0;
  undefined1 local_eb8 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e58;
  undefined1 local_e40 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_de0;
  Parser local_dc8;
  Parser local_d68;
  Parser local_d08;
  Parser local_ca8;
  Parser local_c48;
  Parser local_be8;
  Parser local_b88;
  Parser local_b28;
  Parser local_ac8;
  Parser local_a68;
  Parser local_a08;
  Parser local_9a8;
  Parser local_948;
  Parser local_8e8;
  Parser local_888;
  Parser local_828;
  Parser local_7c8;
  Parser local_768;
  Parser local_708;
  Parser local_6a8;
  Parser local_648;
  Parser local_5e8;
  Parser local_588;
  Parser local_528;
  Parser local_4c8;
  Parser local_468;
  Parser local_408;
  Parser local_3a8;
  Parser local_348;
  Parser local_2e8;
  Parser local_288;
  Parser local_228;
  Parser local_1c8;
  Parser local_168;
  Parser local_108;
  Opt local_a8;
  
  Clara::ExeName::ExeName(&local_1b70,&config->processName);
  Clara::Help::Help((Help *)&local_a8,&config->showHelp);
  Clara::Detail::ComposableParserImpl<Catch::Clara::ExeName>::operator|
            (&local_dc8,&local_1b70.super_ComposableParserImpl<Catch::Clara::ExeName>,
             (Help *)&local_a8);
  Clara::Opt::Opt((Opt *)local_e40,&config->showSuccessfulTests);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e60,"-s",&local_2b89);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_de0,&local_1e60);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e80,"--success",&local_2b8a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_de0,&local_1e80);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1ea0,"include successful tests in output",&local_2b8b);
  std::__cxx11::string::_M_assign((string *)(local_e40 + 0x40));
  Clara::Parser::operator|(&local_d68,&local_dc8,(Opt *)local_e40);
  Clara::Opt::Opt((Opt *)local_eb8,&config->shouldDebugBreak);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1ec0,"-b",&local_2b8c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_e58,&local_1ec0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1ee0,"--break",&local_2b8d);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_e58,&local_1ee0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f00,"break into debugger on failure",&local_2b8e);
  std::__cxx11::string::_M_assign((string *)(local_eb8 + 0x40));
  Clara::Parser::operator|(&local_d08,&local_d68,(Opt *)local_eb8);
  Clara::Opt::Opt((Opt *)local_f30,&config->noThrow);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f20,"-e",&local_2b8f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_ed0,&local_1f20);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f40,"--nothrow",&local_2b90);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_ed0,&local_1f40);
  std::__cxx11::string::string<std::allocator<char>>(local_1f60,"skip exception tests",&local_2b91);
  std::__cxx11::string::_M_assign((string *)(local_f30 + 0x40));
  Clara::Parser::operator|(&local_ca8,&local_d08,(Opt *)local_f30);
  Clara::Opt::Opt((Opt *)local_fa8,&config->showInvisibles);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f80,"-i",&local_2b92);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_f48,&local_1f80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1fa0,"--invisibles",&local_2b93);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_f48,&local_1fa0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1fc0,"show invisibles (tabs, newlines)",&local_2b94);
  std::__cxx11::string::_M_assign((string *)(local_fa8 + 0x40));
  Clara::Parser::operator|(&local_c48,&local_ca8,(Opt *)local_fa8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1fe0,"filename",&local_2b95);
  Clara::Opt::Opt<std::__cxx11::string,void>
            ((Opt *)local_1020,&config->defaultOutputFilename,&local_1fe0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2000,"-o",&local_2b96);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_fc0,&local_2000);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2020,"--out",&local_2b97);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_fc0,&local_2020);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2040,"default output filename",&local_2b98);
  std::__cxx11::string::_M_assign((string *)(local_1020 + 0x40));
  Clara::Parser::operator|(&local_be8,&local_c48,(Opt *)local_1020);
  std::__cxx11::string::string<std::allocator<char>>(local_2060,"name[::key=value]*",&local_2b99);
  local_18f0._0_8_ = &PTR__ParserRefImpl_002f3b00;
  local_18f0._8_4_ = Optional;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  local_1278._0_8_ = &__a2;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002f6270;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_002f62c0;
  local_1278._8_8_ = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundManyLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:3002:34)>,_std::allocator<Catch::Clara::Detail::BoundManyLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:3002:34)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundManyLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:3002:34)>,_std::allocator<Catch::Clara::Detail::BoundManyLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:3002:34)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_1278);
  local_12f0 = (undefined1  [8])0x0;
  a_Stack_12e8[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_18f0._16_8_ = p_Var1 + 1;
  local_18f0._24_8_ = p_Var1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_12e8);
  std::__cxx11::string::string((string *)(local_18f0 + 0x20),local_2060);
  local_18b0._M_p = (pointer)&local_18a0;
  local_18a8 = 0;
  local_18a0._M_local_buf[0] = '\0';
  local_18f0._0_8_ = &PTR__Opt_002f4058;
  local_1890.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1890.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1890.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2080,"-r",&local_2b9a);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1890,&local_2080);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_20a0,"--reporter",&local_2b9b)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1890,&local_20a0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_20c0,"reporter to use (defaults to console)",&local_2b9c);
  std::__cxx11::string::_M_assign((string *)&local_18b0);
  Clara::Parser::operator|(&local_b88,&local_be8,(Opt *)local_18f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_20e0,"name",&local_2b9d);
  Clara::Opt::Opt<std::__cxx11::string,void>((Opt *)local_1278,&config->name,&local_20e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2100,"-n",&local_2b9e);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1218,&local_2100);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2120,"--name",&local_2b9f);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1218,&local_2120);
  std::__cxx11::string::string<std::allocator<char>>(local_2140,"suite name",&local_2ba0);
  std::__cxx11::string::_M_assign(local_1238);
  Clara::Parser::operator|(&local_b28,&local_b88,(Opt *)local_1278);
  local_2b88 = __return_storage_ptr__;
  p_Var2 = (pointer)operator_new(0x20);
  ___a2 = (undefined **)&__a2_1;
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
  (p_Var2->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_002f6328;
  (p_Var2->_M_impl)._M_storage._M_storage.__align =
       (anon_struct_8_0_00000001_for___align)&PTR__BoundRef_002f6378;
  *(ConfigData **)((long)&(p_Var2->_M_impl)._M_storage._M_storage + 8) = config;
  local_1e38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundFlagLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:3096:20)>,_std::allocator<Catch::Clara::Detail::BoundFlagLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:3096:20)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundFlagLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:3096:20)>,_std::allocator<Catch::Clara::Detail::BoundFlagLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:3096:20)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&__a2);
  local_1be8 = (undefined1  [8])0x0;
  _Stack_1be0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ___a2 = (undefined **)&p_Var2->_M_impl;
  local_1e38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var2;
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::ParserRefImpl
            ((ParserRefImpl<Catch::Clara::Opt> *)local_12f0,
             (shared_ptr<Catch::Clara::Detail::BoundRef> *)&__a2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1be0);
  local_12f0 = (undefined1  [8])&PTR__Opt_002f4058;
  local_1290.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1290.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1290.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2160,"-a",&local_2ba1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1290,&local_2160);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2180,"--abort",&local_2ba2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1290,&local_2180);
  std::__cxx11::string::string<std::allocator<char>>
            (local_21a0,"abort at first failure",&local_2ba3);
  std::__cxx11::string::_M_assign(local_12b0);
  Clara::Parser::operator|(&local_ac8,&local_b28,(Opt *)local_12f0);
  std::__cxx11::string::string<std::allocator<char>>(local_21c0,"no. failures",&local_2ba4);
  ___a2 = &PTR__ParserRefImpl_002f3b00;
  local_1e38._M_pi = local_1e38._M_pi & 0xffffffff00000000;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  local_1be8 = (undefined1  [8])&__a2_2;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002f63c8;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_002f6418;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  _Stack_1be0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:3099:20)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:3099:20)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:3099:20)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:3099:20)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_1be8);
  ___a2_1 = (_func_int **)0x0;
  _Stack_1dc0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1e30 = p_Var1 + 1;
  local_1e28._M_pi = p_Var1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1dc0);
  std::__cxx11::string::string(local_1e20,local_21c0);
  local_1e00._M_p = (pointer)&local_1df0;
  local_1df8 = 0;
  local_1df0._M_local_buf[0] = '\0';
  ___a2 = &PTR__Opt_002f4058;
  local_1de0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1de0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1de0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_21e0,"-x",&local_2ba5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1de0,&local_21e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2200,"--abortx",&local_2ba6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1de0,&local_2200);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2220,"abort after x failures",&local_2ba7);
  std::__cxx11::string::_M_assign((string *)&local_1e00);
  Clara::Parser::operator|(&local_a68,&local_ac8,(Opt *)&__a2);
  std::__cxx11::string::string<std::allocator<char>>(local_2240,"warning name",&local_2ba8);
  local_1be8 = (undefined1  [8])&PTR__ParserRefImpl_002f3b00;
  _Stack_1be0._M_pi = _Stack_1be0._M_pi & 0xffffffff00000000;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  ___a2_1 = (undefined **)&__a2_3;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002f6468;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_002f64b8;
  _Stack_1dc0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundManyLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:2897:33)>,_std::allocator<Catch::Clara::Detail::BoundManyLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:2897:33)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundManyLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2897:33)>,_std::allocator<Catch::Clara::Detail::BoundManyLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2897:33)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&__a2_1);
  ___a2_2 = (_func_int **)0x0;
  a_Stack_17f8[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1bd8 = p_Var1 + 1;
  local_1bd0._M_pi = p_Var1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_17f8);
  std::__cxx11::string::string(local_1bc8,local_2240);
  local_1ba8._M_p = (pointer)&local_1b98;
  local_1ba0 = 0;
  local_1b98._M_local_buf[0] = '\0';
  local_1be8 = (undefined1  [8])&PTR__Opt_002f4058;
  local_1b88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2260,"-w",&local_2ba9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1b88,&local_2260);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2280,"--warn",&local_2baa);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1b88,&local_2280);
  std::__cxx11::string::string<std::allocator<char>>(local_22a0,"enable warnings",&local_2bab);
  std::__cxx11::string::_M_assign((string *)&local_1ba8);
  Clara::Parser::operator|(&local_a08,&local_a68,(Opt *)local_1be8);
  std::__cxx11::string::string<std::allocator<char>>(local_22c0,"yes|no",&local_2bac);
  ___a2_1 = &PTR__ParserRefImpl_002f3b00;
  _Stack_1dc0._M_pi = _Stack_1dc0._M_pi & 0xffffffff00000000;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  ___a2_2 = (_func_int **)&__a2_4;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002f6520;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_002f6570;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  a_Stack_17f8[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:3105:20)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:3105:20)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:3105:20)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:3105:20)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&__a2_2);
  ___a2_3 = (_func_int **)0x0;
  _Stack_1c58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1db8 = p_Var1 + 1;
  local_1db0._M_pi = p_Var1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1c58);
  std::__cxx11::string::string(local_1da8,local_22c0);
  local_1d88._M_p = (pointer)&local_1d78;
  local_1d80 = 0;
  local_1d78._M_local_buf[0] = '\0';
  ___a2_1 = &PTR__Opt_002f4058;
  local_1d68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d68.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_22e0,"-d",&local_2bad);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1d68,&local_22e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2300,"--durations",&local_2bae);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1d68,&local_2300);
  std::__cxx11::string::string<std::allocator<char>>(local_2320,"show test durations",&local_2baf);
  std::__cxx11::string::_M_assign((string *)&local_1d88);
  Clara::Parser::operator|(&local_9a8,&local_a08,(Opt *)&__a2_1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2340,"seconds",&local_2bb0);
  Clara::Opt::Opt<double,void>((Opt *)&__a2_2,&config->minDuration,&local_2340);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2360,"-D",&local_2bb1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_17a0,&local_2360);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2380,"--min-duration",&local_2bb2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_17a0,&local_2380);
  std::__cxx11::string::string<std::allocator<char>>
            (local_23a0,"show test durations for tests taking at least the given number of seconds",
             &local_2bb3);
  std::__cxx11::string::_M_assign(local_17c0);
  Clara::Parser::operator|(&local_948,&local_9a8,(Opt *)&__a2_2);
  std::__cxx11::string::string<std::allocator<char>>(local_23c0,"filename",&local_2bb4);
  ___a2_3 = &PTR__ParserRefImpl_002f3b00;
  _Stack_1c58._M_pi = _Stack_1c58._M_pi & 0xffffffff00000000;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  ___a2_4 = (_func_int **)&__a2_5;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002f65c0;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_002f6610;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:2909:44)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:2909:44)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2909:44)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2909:44)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&__a2_4);
  local_1368 = (undefined1  [8])0x0;
  a_Stack_1360[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1c50 = p_Var1 + 1;
  local_1c48._M_pi = p_Var1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_1360);
  std::__cxx11::string::string(local_1c40,local_23c0);
  local_1c20._M_p = (pointer)&local_1c10;
  local_1c18 = 0;
  local_1c10._M_local_buf[0] = '\0';
  ___a2_3 = &PTR__Opt_002f4058;
  local_1c00.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c00.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c00.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_23e0,"-f",&local_2bb5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1c00,&local_23e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2400,"--input-file",&local_2bb6);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1c00,&local_2400);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2420,"load test names to run from a file",&local_2bb7);
  std::__cxx11::string::_M_assign((string *)&local_1c20);
  Clara::Parser::operator|(&local_8e8,&local_948,(Opt *)&__a2_3);
  Clara::Opt::Opt((Opt *)&__a2_4,&config->filenamesAsTags);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2440,"-#",&local_2bb8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_15d8,&local_2440);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2460,"--filenames-as-tags",&local_2bb9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_15d8,&local_2460);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2480,"adds a tag for the filename",&local_2bba);
  std::__cxx11::string::_M_assign(local_15f8);
  Clara::Parser::operator|(&local_888,&local_8e8,(Opt *)&__a2_4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_24a0,"section name",&local_2bbb);
  Clara::Opt::Opt<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            ((Opt *)local_1368,&config->sectionsToRun,&local_24a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_24c0,"-c",&local_2bbc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1308,&local_24c0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_24e0,"--section",&local_2bbd);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1308,&local_24e0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2500,"specify section to run",&local_2bbe);
  std::__cxx11::string::_M_assign(local_1328);
  Clara::Parser::operator|(&local_828,&local_888,(Opt *)local_1368);
  std::__cxx11::string::string<std::allocator<char>>(local_2520,"quiet|normal|high",&local_2bbf);
  ___a2_5 = &PTR__ParserRefImpl_002f3b00;
  puVar3 = (undefined8 *)operator_new(0x20);
  local_13e0._0_8_ = &__a2_6;
  puVar3[1] = 0x100000001;
  *puVar3 = &PTR___Sp_counted_ptr_inplace_002f6660;
  puVar3[2] = &PTR__BoundRef_002f66b0;
  puVar3[3] = config;
  local_13e0._8_8_ = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:2990:35)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:2990:35)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2990:35)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2990:35)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_13e0);
  local_1458 = (undefined1  [8])0x0;
  a_Stack_1450[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_1450);
  std::__cxx11::string::string(local_1a38,local_2520);
  local_1a18._M_p = (pointer)&local_1a08;
  local_1a10 = 0;
  local_1a08._M_local_buf[0] = '\0';
  ___a2_5 = &PTR__Opt_002f4058;
  local_19f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_19f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_19f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2540,"-v",&local_2bc0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_19f8,&local_2540);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2560,"--verbosity",&local_2bc1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_19f8,&local_2560);
  std::__cxx11::string::string<std::allocator<char>>(local_2580,"set output verbosity",&local_2bc2);
  std::__cxx11::string::_M_assign((string *)&local_1a18);
  Clara::Parser::operator|(&local_7c8,&local_828,(Opt *)&__a2_5);
  Clara::Opt::Opt((Opt *)local_13e0,&config->listTests);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_25a0,"--list-tests",&local_2bc3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1380,&local_25a0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_25c0,"list all/matching test cases",&local_2bc4);
  std::__cxx11::string::_M_assign(local_13a0);
  Clara::Parser::operator|(&local_768,&local_7c8,(Opt *)local_13e0);
  Clara::Opt::Opt((Opt *)local_1458,&config->listTags);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_25e0,"--list-tags",&local_2bc5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_13f8,&local_25e0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2600,"list all/matching tags",&local_2bc6);
  std::__cxx11::string::_M_assign(local_1418);
  Clara::Parser::operator|(&local_708,&local_768,(Opt *)local_1458);
  Clara::Opt::Opt((Opt *)&__a2_6,&config->listReporters);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2620,"--list-reporters",&local_2bc7);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1470,&local_2620);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2640,"list all available reporters",&local_2bc8);
  std::__cxx11::string::_M_assign(local_1490);
  Clara::Parser::operator|(&local_6a8,&local_708,(Opt *)&__a2_6);
  Clara::Opt::Opt((Opt *)local_1098,&config->listListeners);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2660,"--list-listeners",&local_2bc9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1038,&local_2660);
  std::__cxx11::string::string<std::allocator<char>>(local_2680,"list all listeners",&local_2bca);
  std::__cxx11::string::_M_assign((string *)(local_1098 + 0x40));
  Clara::Parser::operator|(&local_648,&local_6a8,(Opt *)local_1098);
  std::__cxx11::string::string<std::allocator<char>>(local_26a0,"decl|lex|rand",&local_2bcb);
  local_1968._0_8_ = &PTR__ParserRefImpl_002f3b00;
  local_1968._8_4_ = Optional;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  local_1ad0 = (undefined1  [8])&__a2_7;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002f6700;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_002f6750;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  local_1ac8 = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:2930:35)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:2930:35)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2930:35)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2930:35)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_1ad0);
  local_1cd8 = (undefined1  [8])0x0;
  _Stack_1cd0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1968._16_8_ = p_Var1 + 1;
  local_1968._24_8_ = p_Var1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1cd0);
  std::__cxx11::string::string((string *)(local_1968 + 0x20),local_26a0);
  local_1928._M_p = (pointer)&local_1918;
  local_1920 = 0;
  local_1918._M_local_buf[0] = '\0';
  local_1968._0_8_ = &PTR__Opt_002f4058;
  local_1908.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1908.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1908.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_26c0,"--order",&local_2bcc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1908,&local_26c0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_26e0,"test case order (defaults to decl)",&local_2bcd);
  std::__cxx11::string::_M_assign((string *)&local_1928);
  Clara::Parser::operator|(&local_5e8,&local_648,(Opt *)local_1968);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2700,"\'time\'|\'random-device\'|number",&local_2bce);
  local_1ad0 = (undefined1  [8])&PTR__ParserRefImpl_002f3b00;
  local_1ac8 = (pointer)((ulong)local_1ac8 & 0xffffffff00000000);
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  local_1cd8 = (undefined1  [8])&__a2_8;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002f67a0;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_002f67f0;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  _Stack_1cd0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:2941:33)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:2941:33)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2941:33)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2941:33)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_1cd8);
  ___a2_7 = (_func_int **)0x0;
  a_Stack_1870[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1ac0 = p_Var1 + 1;
  local_1ab8._M_pi = p_Var1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_1870);
  std::__cxx11::string::string(local_1ab0,local_2700);
  local_1a90._M_p = (pointer)&local_1a80;
  local_1a88 = 0;
  local_1a80._M_local_buf[0] = '\0';
  local_1ad0 = (undefined1  [8])&PTR__Opt_002f4058;
  local_1a70.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a70.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a70.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2720,"--rng-seed",&local_2bcf)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1a70,&local_2720);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2740,"set a specific seed for random numbers",&local_2bd0);
  std::__cxx11::string::_M_assign((string *)&local_1a90);
  Clara::Parser::operator|(&local_588,&local_5e8,(Opt *)local_1ad0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2760,"ansi|win32|none|default",&local_2bd1);
  local_1cd8 = (undefined1  [8])&PTR__ParserRefImpl_002f3b00;
  _Stack_1cd0._M_pi = _Stack_1cd0._M_pi & 0xffffffff00000000;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  ___a2_7 = (_func_int **)&__a2_9;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002f6840;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_002f6890;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  a_Stack_1870[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:2959:43)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:2959:43)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2959:43)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2959:43)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&__a2_7);
  ___a2_8 = (_func_int **)0x0;
  _Stack_1d48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1cc8 = p_Var1 + 1;
  local_1cc0._M_pi = p_Var1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1d48);
  std::__cxx11::string::string(local_1cb8,local_2760);
  local_1c98._M_p = (pointer)&local_1c88;
  local_1c90 = 0;
  local_1c88._M_local_buf[0] = '\0';
  local_1cd8 = (undefined1  [8])&PTR__Opt_002f4058;
  local_1c78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c78.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2780,"--colour-mode",&local_2bd2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1c78,&local_2780);
  std::__cxx11::string::string<std::allocator<char>>
            (local_27a0,"what color mode should be used as default",&local_2bd3);
  std::__cxx11::string::_M_assign((string *)&local_1c98);
  Clara::Parser::operator|(&local_528,&local_588,(Opt *)local_1cd8);
  Clara::Opt::Opt((Opt *)&__a2_7,&config->libIdentify);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_27c0,"--libidentify",&local_2bd4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1818,&local_27c0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_27e0,"report name and version according to libidentify standard",&local_2bd5);
  std::__cxx11::string::_M_assign(local_1838);
  Clara::Parser::operator|(&local_4c8,&local_528,(Opt *)&__a2_7);
  std::__cxx11::string::string<std::allocator<char>>(local_2800,"never|start|exit|both",&local_2bd6)
  ;
  ___a2_8 = &PTR__ParserRefImpl_002f3b00;
  _Stack_1d48._M_pi = _Stack_1d48._M_pi & 0xffffffff00000000;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  ___a2_9 = (_func_int **)&__a2_10;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002f68e0;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_002f6930;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:2976:41)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:2976:41)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2976:41)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:2976:41)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&__a2_9);
  local_1548 = (undefined1  [8])0x0;
  a_Stack_1540[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1d40 = p_Var1 + 1;
  local_1d38._M_pi = p_Var1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_1540);
  std::__cxx11::string::string(local_1d30,local_2800);
  local_1d10._M_p = (pointer)&local_1d00;
  local_1d08 = 0;
  local_1d00._M_local_buf[0] = '\0';
  ___a2_8 = &PTR__Opt_002f4058;
  local_1cf0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1cf0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1cf0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2820,"--wait-for-keypress",&local_2bd7);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1cf0,&local_2820);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2840,"waits for a keypress before exiting",&local_2bd8);
  std::__cxx11::string::_M_assign((string *)&local_1d10);
  Clara::Parser::operator|(&local_468,&local_4c8,(Opt *)&__a2_8);
  Clara::Opt::Opt((Opt *)&__a2_9,&config->skipBenchmarks);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2860,"--skip-benchmarks",&local_2bd9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1650,&local_2860);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2880,"disable running benchmarks",&local_2bda);
  std::__cxx11::string::_M_assign(local_1670);
  Clara::Parser::operator|(&local_408,&local_468,(Opt *)&__a2_9);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28a0,"samples",&local_2bdb);
  Clara::Opt::Opt<unsigned_int,void>((Opt *)local_1548,&config->benchmarkSamples,&local_28a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28c0,"--benchmark-samples",&local_2bdc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_14e8,&local_28c0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_28e0,"number of samples to collect (default: 100)",&local_2bdd);
  std::__cxx11::string::_M_assign(local_1508);
  Clara::Parser::operator|(&local_3a8,&local_408,(Opt *)local_1548);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2900,"resamples",&local_2bde);
  Clara::Opt::Opt<unsigned_int,void>((Opt *)&__a2_10,&config->benchmarkResamples,&local_2900);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2920,"--benchmark-resamples",&local_2bdf);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1560,&local_2920);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2940,"number of resamples for the bootstrap (default: 100000)",&local_2be0);
  std::__cxx11::string::_M_assign(local_1580);
  Clara::Parser::operator|(&local_348,&local_3a8,(Opt *)&__a2_10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2960,"confidence interval",&local_2be1);
  Clara::Opt::Opt<double,void>((Opt *)local_1110,&config->benchmarkConfidenceInterval,&local_2960);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2980,"--benchmark-confidence-interval",&local_2be2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_10b0,&local_2980);
  std::__cxx11::string::string<std::allocator<char>>
            (local_29a0,"confidence interval for the bootstrap (between 0 and 1, default: 0.95)",
             &local_2be3);
  std::__cxx11::string::_M_assign((string *)(local_1110 + 0x40));
  Clara::Parser::operator|(&local_2e8,&local_348,(Opt *)local_1110);
  Clara::Opt::Opt((Opt *)local_1188,&config->benchmarkNoAnalysis);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_29c0,"--benchmark-no-analysis",&local_2be4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1128,&local_29c0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_29e0,"perform only measurements; do not perform any analysis",&local_2be5);
  std::__cxx11::string::_M_assign((string *)(local_1188 + 0x40));
  Clara::Parser::operator|(&local_288,&local_2e8,(Opt *)local_1188);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a00,"benchmarkWarmupTime",&local_2be6);
  Clara::Opt::Opt<long,void>((Opt *)local_1200,&config->benchmarkWarmupTime,&local_2a00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a20,"--benchmark-warmup-time",&local_2be7);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_11a0,&local_2a20);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2a40,
             "amount of time in milliseconds spent on warming up each test (default: 100)",
             &local_2be8);
  std::__cxx11::string::_M_assign((string *)(local_1200 + 0x40));
  Clara::Parser::operator|(&local_228,&local_288,(Opt *)local_1200);
  std::__cxx11::string::string<std::allocator<char>>(local_2a60,"shard count",&local_2be9);
  local_19e0._0_8_ = &PTR__ParserRefImpl_002f3b00;
  local_19e0._8_4_ = Optional;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  local_1b48 = (undefined1  [8])&__a2_11;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002f6980;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_002f69d0;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  local_1b40 = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:3048:36)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:3048:36)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:3048:36)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:3048:36)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_1b48);
  local_1728 = (undefined1  [8])0x0;
  a_Stack_1720[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_19e0._16_8_ = p_Var1 + 1;
  local_19e0._24_8_ = p_Var1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_1720);
  std::__cxx11::string::string((string *)(local_19e0 + 0x20),local_2a60);
  local_19a0._M_p = (pointer)&local_1990;
  local_1998 = 0;
  local_1990._M_local_buf[0] = '\0';
  local_19e0._0_8_ = &PTR__Opt_002f4058;
  local_1980.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1980.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1980.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a80,"--shard-count",&local_2bea);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1980,&local_2a80);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2aa0,"split the tests to execute into this many groups",&local_2beb);
  std::__cxx11::string::_M_assign((string *)&local_19a0);
  Clara::Parser::operator|(&local_1c8,&local_228,(Opt *)local_19e0);
  std::__cxx11::string::string<std::allocator<char>>(local_2ac0,"shard index",&local_2bec);
  local_1b48 = (undefined1  [8])&PTR__ParserRefImpl_002f3b00;
  local_1b40 = (pointer)((ulong)local_1b40 & 0xffffffff00000000);
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  local_1728 = (undefined1  [8])&__a2_12;
  p_Var1->_M_use_count = 1;
  p_Var1->_M_weak_count = 1;
  p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_002f6a20;
  p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__BoundRef_002f6a70;
  *(ConfigData **)&p_Var1[1]._M_use_count = config;
  a_Stack_1720[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:3062:36)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp:3062:36)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:3062:36)>,_std::allocator<Catch::Clara::Detail::BoundLambda<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_quickfix[P]quickfix_src_C___test_catch_amalgamated_cpp:3062:36)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_1728);
  ___a2_11 = (_func_int **)0x0;
  a_Stack_1780[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1b38 = p_Var1 + 1;
  local_1b30._M_pi = p_Var1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_1780);
  std::__cxx11::string::string(local_1b28,local_2ac0);
  local_1b08._M_p = (pointer)&local_1af8;
  local_1b00 = 0;
  local_1af8._M_local_buf[0] = '\0';
  local_1b48 = (undefined1  [8])&PTR__Opt_002f4058;
  local_1ae8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1ae8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1ae8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&__a2_12,"--shard-index",&local_2bed)
  ;
  __return_storage_ptr___00 = local_2b88;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1ae8,(value_type *)&__a2_12);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2ae0,"index of the group of tests to execute (see --shard-count)",&local_2bee);
  std::__cxx11::string::_M_assign((string *)&local_1b08);
  Clara::Parser::operator|(&local_168,&local_1c8,(Opt *)local_1b48);
  Clara::Opt::Opt((Opt *)local_1728,&config->allowZeroTests);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b00,"--allow-running-no-tests",&local_2bef);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_16c8,&local_2b00);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2b20,"Treat \'No tests run\' as a success",&local_2bf0);
  std::__cxx11::string::_M_assign(local_16e8);
  Clara::Parser::operator|(&local_108,&local_168,(Opt *)local_1728);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b40,"test name|pattern|tags",&local_2bf1);
  Clara::Arg::
  ParserRefImpl<std::vector<std::__cxx11::string,std::allocator<std::char_traits<char>>>,void>
            ((Arg *)&__a2_11,&config->testsOrTags,&local_2b40);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2b60,"which test or tests to use",&local_2bf2);
  std::__cxx11::string::_M_assign(local_1748);
  Clara::Parser::operator|(__return_storage_ptr___00,&local_108,(Arg *)&__a2_11);
  std::__cxx11::string::~string(local_2b60);
  Clara::Detail::ParserRefImpl<Catch::Clara::Arg>::~ParserRefImpl
            ((ParserRefImpl<Catch::Clara::Arg> *)&__a2_11);
  std::__cxx11::string::~string((string *)&local_2b40);
  Clara::Parser::~Parser(&local_108);
  std::__cxx11::string::~string(local_2b20);
  std::__cxx11::string::~string((string *)&local_2b00);
  Clara::Opt::~Opt((Opt *)local_1728);
  Clara::Parser::~Parser(&local_168);
  std::__cxx11::string::~string(local_2ae0);
  std::__cxx11::string::~string((string *)&__a2_12);
  Clara::Opt::~Opt((Opt *)local_1b48);
  std::__cxx11::string::~string(local_2ac0);
  Clara::Parser::~Parser(&local_1c8);
  std::__cxx11::string::~string(local_2aa0);
  std::__cxx11::string::~string((string *)&local_2a80);
  Clara::Opt::~Opt((Opt *)local_19e0);
  std::__cxx11::string::~string(local_2a60);
  Clara::Parser::~Parser(&local_228);
  std::__cxx11::string::~string(local_2a40);
  std::__cxx11::string::~string((string *)&local_2a20);
  Clara::Opt::~Opt((Opt *)local_1200);
  std::__cxx11::string::~string((string *)&local_2a00);
  Clara::Parser::~Parser(&local_288);
  std::__cxx11::string::~string(local_29e0);
  std::__cxx11::string::~string((string *)&local_29c0);
  Clara::Opt::~Opt((Opt *)local_1188);
  Clara::Parser::~Parser(&local_2e8);
  std::__cxx11::string::~string(local_29a0);
  std::__cxx11::string::~string((string *)&local_2980);
  Clara::Opt::~Opt((Opt *)local_1110);
  std::__cxx11::string::~string((string *)&local_2960);
  Clara::Parser::~Parser(&local_348);
  std::__cxx11::string::~string(local_2940);
  std::__cxx11::string::~string((string *)&local_2920);
  Clara::Opt::~Opt((Opt *)&__a2_10);
  std::__cxx11::string::~string((string *)&local_2900);
  Clara::Parser::~Parser(&local_3a8);
  std::__cxx11::string::~string(local_28e0);
  std::__cxx11::string::~string((string *)&local_28c0);
  Clara::Opt::~Opt((Opt *)local_1548);
  std::__cxx11::string::~string((string *)&local_28a0);
  Clara::Parser::~Parser(&local_408);
  std::__cxx11::string::~string(local_2880);
  std::__cxx11::string::~string((string *)&local_2860);
  Clara::Opt::~Opt((Opt *)&__a2_9);
  Clara::Parser::~Parser(&local_468);
  std::__cxx11::string::~string(local_2840);
  std::__cxx11::string::~string((string *)&local_2820);
  Clara::Opt::~Opt((Opt *)&__a2_8);
  std::__cxx11::string::~string(local_2800);
  Clara::Parser::~Parser(&local_4c8);
  std::__cxx11::string::~string(local_27e0);
  std::__cxx11::string::~string((string *)&local_27c0);
  Clara::Opt::~Opt((Opt *)&__a2_7);
  Clara::Parser::~Parser(&local_528);
  std::__cxx11::string::~string(local_27a0);
  std::__cxx11::string::~string((string *)&local_2780);
  Clara::Opt::~Opt((Opt *)local_1cd8);
  std::__cxx11::string::~string(local_2760);
  Clara::Parser::~Parser(&local_588);
  std::__cxx11::string::~string(local_2740);
  std::__cxx11::string::~string((string *)&local_2720);
  Clara::Opt::~Opt((Opt *)local_1ad0);
  std::__cxx11::string::~string(local_2700);
  Clara::Parser::~Parser(&local_5e8);
  std::__cxx11::string::~string(local_26e0);
  std::__cxx11::string::~string((string *)&local_26c0);
  Clara::Opt::~Opt((Opt *)local_1968);
  std::__cxx11::string::~string(local_26a0);
  Clara::Parser::~Parser(&local_648);
  std::__cxx11::string::~string(local_2680);
  std::__cxx11::string::~string((string *)&local_2660);
  Clara::Opt::~Opt((Opt *)local_1098);
  Clara::Parser::~Parser(&local_6a8);
  std::__cxx11::string::~string(local_2640);
  std::__cxx11::string::~string((string *)&local_2620);
  Clara::Opt::~Opt((Opt *)&__a2_6);
  Clara::Parser::~Parser(&local_708);
  std::__cxx11::string::~string(local_2600);
  std::__cxx11::string::~string((string *)&local_25e0);
  Clara::Opt::~Opt((Opt *)local_1458);
  Clara::Parser::~Parser(&local_768);
  std::__cxx11::string::~string(local_25c0);
  std::__cxx11::string::~string((string *)&local_25a0);
  Clara::Opt::~Opt((Opt *)local_13e0);
  Clara::Parser::~Parser(&local_7c8);
  std::__cxx11::string::~string(local_2580);
  std::__cxx11::string::~string((string *)&local_2560);
  std::__cxx11::string::~string((string *)&local_2540);
  Clara::Opt::~Opt((Opt *)&__a2_5);
  std::__cxx11::string::~string(local_2520);
  Clara::Parser::~Parser(&local_828);
  std::__cxx11::string::~string(local_2500);
  std::__cxx11::string::~string((string *)&local_24e0);
  std::__cxx11::string::~string((string *)&local_24c0);
  Clara::Opt::~Opt((Opt *)local_1368);
  std::__cxx11::string::~string((string *)&local_24a0);
  Clara::Parser::~Parser(&local_888);
  std::__cxx11::string::~string(local_2480);
  std::__cxx11::string::~string((string *)&local_2460);
  std::__cxx11::string::~string((string *)&local_2440);
  Clara::Opt::~Opt((Opt *)&__a2_4);
  Clara::Parser::~Parser(&local_8e8);
  std::__cxx11::string::~string(local_2420);
  std::__cxx11::string::~string((string *)&local_2400);
  std::__cxx11::string::~string((string *)&local_23e0);
  Clara::Opt::~Opt((Opt *)&__a2_3);
  std::__cxx11::string::~string(local_23c0);
  Clara::Parser::~Parser(&local_948);
  std::__cxx11::string::~string(local_23a0);
  std::__cxx11::string::~string((string *)&local_2380);
  std::__cxx11::string::~string((string *)&local_2360);
  Clara::Opt::~Opt((Opt *)&__a2_2);
  std::__cxx11::string::~string((string *)&local_2340);
  Clara::Parser::~Parser(&local_9a8);
  std::__cxx11::string::~string(local_2320);
  std::__cxx11::string::~string((string *)&local_2300);
  std::__cxx11::string::~string((string *)&local_22e0);
  Clara::Opt::~Opt((Opt *)&__a2_1);
  std::__cxx11::string::~string(local_22c0);
  Clara::Parser::~Parser(&local_a08);
  std::__cxx11::string::~string(local_22a0);
  std::__cxx11::string::~string((string *)&local_2280);
  std::__cxx11::string::~string((string *)&local_2260);
  Clara::Opt::~Opt((Opt *)local_1be8);
  std::__cxx11::string::~string(local_2240);
  Clara::Parser::~Parser(&local_a68);
  std::__cxx11::string::~string(local_2220);
  std::__cxx11::string::~string((string *)&local_2200);
  std::__cxx11::string::~string((string *)&local_21e0);
  Clara::Opt::~Opt((Opt *)&__a2);
  std::__cxx11::string::~string(local_21c0);
  Clara::Parser::~Parser(&local_ac8);
  std::__cxx11::string::~string(local_21a0);
  std::__cxx11::string::~string((string *)&local_2180);
  std::__cxx11::string::~string((string *)&local_2160);
  Clara::Opt::~Opt((Opt *)local_12f0);
  Clara::Parser::~Parser(&local_b28);
  std::__cxx11::string::~string(local_2140);
  std::__cxx11::string::~string((string *)&local_2120);
  std::__cxx11::string::~string((string *)&local_2100);
  Clara::Opt::~Opt((Opt *)local_1278);
  std::__cxx11::string::~string((string *)&local_20e0);
  Clara::Parser::~Parser(&local_b88);
  std::__cxx11::string::~string(local_20c0);
  std::__cxx11::string::~string((string *)&local_20a0);
  std::__cxx11::string::~string((string *)&local_2080);
  Clara::Opt::~Opt((Opt *)local_18f0);
  std::__cxx11::string::~string(local_2060);
  Clara::Parser::~Parser(&local_be8);
  std::__cxx11::string::~string(local_2040);
  std::__cxx11::string::~string((string *)&local_2020);
  std::__cxx11::string::~string((string *)&local_2000);
  Clara::Opt::~Opt((Opt *)local_1020);
  std::__cxx11::string::~string((string *)&local_1fe0);
  Clara::Parser::~Parser(&local_c48);
  std::__cxx11::string::~string(local_1fc0);
  std::__cxx11::string::~string((string *)&local_1fa0);
  std::__cxx11::string::~string((string *)&local_1f80);
  Clara::Opt::~Opt((Opt *)local_fa8);
  Clara::Parser::~Parser(&local_ca8);
  std::__cxx11::string::~string(local_1f60);
  std::__cxx11::string::~string((string *)&local_1f40);
  std::__cxx11::string::~string((string *)&local_1f20);
  Clara::Opt::~Opt((Opt *)local_f30);
  Clara::Parser::~Parser(&local_d08);
  std::__cxx11::string::~string(local_1f00);
  std::__cxx11::string::~string((string *)&local_1ee0);
  std::__cxx11::string::~string((string *)&local_1ec0);
  Clara::Opt::~Opt((Opt *)local_eb8);
  Clara::Parser::~Parser(&local_d68);
  std::__cxx11::string::~string(local_1ea0);
  std::__cxx11::string::~string((string *)&local_1e80);
  std::__cxx11::string::~string((string *)&local_1e60);
  Clara::Opt::~Opt((Opt *)local_e40);
  Clara::Parser::~Parser(&local_dc8);
  Clara::Opt::~Opt(&local_a8);
  Clara::ExeName::~ExeName(&local_1b70);
  return __return_storage_ptr___00;
}

Assistant:

Clara::Parser makeCommandLineParser( ConfigData& config ) {

        using namespace Clara;

        auto const setWarning = [&]( std::string const& warning ) {
            if ( warning == "NoAssertions" ) {
                config.warnings = static_cast<WarnAbout::What>(config.warnings | WarnAbout::NoAssertions);
                return ParserResult::ok( ParseResultType::Matched );
            } else if ( warning == "UnmatchedTestSpec" ) {
                config.warnings = static_cast<WarnAbout::What>(config.warnings | WarnAbout::UnmatchedTestSpec);
                return ParserResult::ok( ParseResultType::Matched );
            }

            return ParserResult ::runtimeError(
                "Unrecognised warning option: '" + warning + '\'' );
        };
        auto const loadTestNamesFromFile = [&]( std::string const& filename ) {
                std::ifstream f( filename.c_str() );
                if( !f.is_open() )
                    return ParserResult::runtimeError( "Unable to load input file: '" + filename + '\'' );

                std::string line;
                while( std::getline( f, line ) ) {
                    line = trim(line);
                    if( !line.empty() && !startsWith( line, '#' ) ) {
                        if( !startsWith( line, '"' ) )
                            line = '"' + line + '"';
                        config.testsOrTags.push_back( line );
                        config.testsOrTags.emplace_back( "," );
                    }
                }
                //Remove comma in the end
                if(!config.testsOrTags.empty())
                    config.testsOrTags.erase( config.testsOrTags.end()-1 );

                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setTestOrder = [&]( std::string const& order ) {
                if( startsWith( "declared", order ) )
                    config.runOrder = TestRunOrder::Declared;
                else if( startsWith( "lexical", order ) )
                    config.runOrder = TestRunOrder::LexicographicallySorted;
                else if( startsWith( "random", order ) )
                    config.runOrder = TestRunOrder::Randomized;
                else
                    return ParserResult::runtimeError( "Unrecognised ordering: '" + order + '\'' );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setRngSeed = [&]( std::string const& seed ) {
                if( seed == "time" ) {
                    config.rngSeed = generateRandomSeed(GenerateFrom::Time);
                    return ParserResult::ok(ParseResultType::Matched);
                } else if (seed == "random-device") {
                    config.rngSeed = generateRandomSeed(GenerateFrom::RandomDevice);
                    return ParserResult::ok(ParseResultType::Matched);
                }

                // TODO: ideally we should be parsing uint32_t directly
                //       fix this later when we add new parse overload
                auto parsedSeed = parseUInt( seed, 0 );
                if ( !parsedSeed ) {
                    return ParserResult::runtimeError( "Could not parse '" + seed + "' as seed" );
                }
                config.rngSeed = *parsedSeed;
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setDefaultColourMode = [&]( std::string const& colourMode ) {
            Optional<ColourMode> maybeMode = Catch::Detail::stringToColourMode(toLower( colourMode ));
            if ( !maybeMode ) {
                return ParserResult::runtimeError(
                    "colour mode must be one of: default, ansi, win32, "
                    "or none. '" +
                    colourMode + "' is not recognised" );
            }
            auto mode = *maybeMode;
            if ( !isColourImplAvailable( mode ) ) {
                return ParserResult::runtimeError(
                    "colour mode '" + colourMode +
                    "' is not supported in this binary" );
            }
            config.defaultColourMode = mode;
            return ParserResult::ok( ParseResultType::Matched );
        };
        auto const setWaitForKeypress = [&]( std::string const& keypress ) {
                auto keypressLc = toLower( keypress );
                if (keypressLc == "never")
                    config.waitForKeypress = WaitForKeypress::Never;
                else if( keypressLc == "start" )
                    config.waitForKeypress = WaitForKeypress::BeforeStart;
                else if( keypressLc == "exit" )
                    config.waitForKeypress = WaitForKeypress::BeforeExit;
                else if( keypressLc == "both" )
                    config.waitForKeypress = WaitForKeypress::BeforeStartAndExit;
                else
                    return ParserResult::runtimeError( "keypress argument must be one of: never, start, exit or both. '" + keypress + "' not recognised" );
            return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setVerbosity = [&]( std::string const& verbosity ) {
            auto lcVerbosity = toLower( verbosity );
            if( lcVerbosity == "quiet" )
                config.verbosity = Verbosity::Quiet;
            else if( lcVerbosity == "normal" )
                config.verbosity = Verbosity::Normal;
            else if( lcVerbosity == "high" )
                config.verbosity = Verbosity::High;
            else
                return ParserResult::runtimeError( "Unrecognised verbosity, '" + verbosity + '\'' );
            return ParserResult::ok( ParseResultType::Matched );
        };
        auto const setReporter = [&]( std::string const& userReporterSpec ) {
            if ( userReporterSpec.empty() ) {
                return ParserResult::runtimeError( "Received empty reporter spec." );
            }

            Optional<ReporterSpec> parsed =
                parseReporterSpec( userReporterSpec );
            if ( !parsed ) {
                return ParserResult::runtimeError(
                    "Could not parse reporter spec '" + userReporterSpec +
                    "'" );
            }

            auto const& reporterSpec = *parsed;

            auto const& factories =
                getRegistryHub().getReporterRegistry().getFactories();
            auto result = factories.find( reporterSpec.name() );

            if ( result == factories.end() ) {
                return ParserResult::runtimeError(
                    "Unrecognized reporter, '" + reporterSpec.name() +
                    "'. Check available with --list-reporters" );
            }


            const bool hadOutputFile = reporterSpec.outputFile().some();
            config.reporterSpecifications.push_back( CATCH_MOVE( *parsed ) );
            // It would be enough to check this only once at the very end, but
            // there is  not a place where we could call this check, so do it
            // every time it could fail. For valid inputs, this is still called
            // at most once.
            if (!hadOutputFile) {
                int n_reporters_without_file = 0;
                for (auto const& spec : config.reporterSpecifications) {
                    if (spec.outputFile().none()) {
                        n_reporters_without_file++;
                    }
                }
                if (n_reporters_without_file > 1) {
                    return ParserResult::runtimeError( "Only one reporter may have unspecified output file." );
                }
            }

            return ParserResult::ok( ParseResultType::Matched );
        };
        auto const setShardCount = [&]( std::string const& shardCount ) {
            auto parsedCount = parseUInt( shardCount );
            if ( !parsedCount ) {
                return ParserResult::runtimeError(
                    "Could not parse '" + shardCount + "' as shard count" );
            }
            if ( *parsedCount == 0 ) {
                return ParserResult::runtimeError(
                    "Shard count must be positive" );
            }
            config.shardCount = *parsedCount;
            return ParserResult::ok( ParseResultType::Matched );
        };

        auto const setShardIndex = [&](std::string const& shardIndex) {
            auto parsedIndex = parseUInt( shardIndex );
            if ( !parsedIndex ) {
                return ParserResult::runtimeError(
                    "Could not parse '" + shardIndex + "' as shard index" );
            }
            config.shardIndex = *parsedIndex;
            return ParserResult::ok( ParseResultType::Matched );
        };

        auto cli
            = ExeName( config.processName )
            | Help( config.showHelp )
            | Opt( config.showSuccessfulTests )
                ["-s"]["--success"]
                ( "include successful tests in output" )
            | Opt( config.shouldDebugBreak )
                ["-b"]["--break"]
                ( "break into debugger on failure" )
            | Opt( config.noThrow )
                ["-e"]["--nothrow"]
                ( "skip exception tests" )
            | Opt( config.showInvisibles )
                ["-i"]["--invisibles"]
                ( "show invisibles (tabs, newlines)" )
            | Opt( config.defaultOutputFilename, "filename" )
                ["-o"]["--out"]
                ( "default output filename" )
            | Opt( accept_many, setReporter, "name[::key=value]*" )
                ["-r"]["--reporter"]
                ( "reporter to use (defaults to console)" )
            | Opt( config.name, "name" )
                ["-n"]["--name"]
                ( "suite name" )
            | Opt( [&]( bool ){ config.abortAfter = 1; } )
                ["-a"]["--abort"]
                ( "abort at first failure" )
            | Opt( [&]( int x ){ config.abortAfter = x; }, "no. failures" )
                ["-x"]["--abortx"]
                ( "abort after x failures" )
            | Opt( accept_many, setWarning, "warning name" )
                ["-w"]["--warn"]
                ( "enable warnings" )
            | Opt( [&]( bool flag ) { config.showDurations = flag ? ShowDurations::Always : ShowDurations::Never; }, "yes|no" )
                ["-d"]["--durations"]
                ( "show test durations" )
            | Opt( config.minDuration, "seconds" )
                ["-D"]["--min-duration"]
                ( "show test durations for tests taking at least the given number of seconds" )
            | Opt( loadTestNamesFromFile, "filename" )
                ["-f"]["--input-file"]
                ( "load test names to run from a file" )
            | Opt( config.filenamesAsTags )
                ["-#"]["--filenames-as-tags"]
                ( "adds a tag for the filename" )
            | Opt( config.sectionsToRun, "section name" )
                ["-c"]["--section"]
                ( "specify section to run" )
            | Opt( setVerbosity, "quiet|normal|high" )
                ["-v"]["--verbosity"]
                ( "set output verbosity" )
            | Opt( config.listTests )
                ["--list-tests"]
                ( "list all/matching test cases" )
            | Opt( config.listTags )
                ["--list-tags"]
                ( "list all/matching tags" )
            | Opt( config.listReporters )
                ["--list-reporters"]
                ( "list all available reporters" )
            | Opt( config.listListeners )
                ["--list-listeners"]
                ( "list all listeners" )
            | Opt( setTestOrder, "decl|lex|rand" )
                ["--order"]
                ( "test case order (defaults to decl)" )
            | Opt( setRngSeed, "'time'|'random-device'|number" )
                ["--rng-seed"]
                ( "set a specific seed for random numbers" )
            | Opt( setDefaultColourMode, "ansi|win32|none|default" )
                ["--colour-mode"]
                ( "what color mode should be used as default" )
            | Opt( config.libIdentify )
                ["--libidentify"]
                ( "report name and version according to libidentify standard" )
            | Opt( setWaitForKeypress, "never|start|exit|both" )
                ["--wait-for-keypress"]
                ( "waits for a keypress before exiting" )
            | Opt( config.skipBenchmarks)
                ["--skip-benchmarks"]
                ( "disable running benchmarks")
            | Opt( config.benchmarkSamples, "samples" )
                ["--benchmark-samples"]
                ( "number of samples to collect (default: 100)" )
            | Opt( config.benchmarkResamples, "resamples" )
                ["--benchmark-resamples"]
                ( "number of resamples for the bootstrap (default: 100000)" )
            | Opt( config.benchmarkConfidenceInterval, "confidence interval" )
                ["--benchmark-confidence-interval"]
                ( "confidence interval for the bootstrap (between 0 and 1, default: 0.95)" )
            | Opt( config.benchmarkNoAnalysis )
                ["--benchmark-no-analysis"]
                ( "perform only measurements; do not perform any analysis" )
            | Opt( config.benchmarkWarmupTime, "benchmarkWarmupTime" )
                ["--benchmark-warmup-time"]
                ( "amount of time in milliseconds spent on warming up each test (default: 100)" )
            | Opt( setShardCount, "shard count" )
                ["--shard-count"]
                ( "split the tests to execute into this many groups" )
            | Opt( setShardIndex, "shard index" )
                ["--shard-index"]
                ( "index of the group of tests to execute (see --shard-count)" ) |
            Opt( config.allowZeroTests )
                ["--allow-running-no-tests"]
                ( "Treat 'No tests run' as a success" )
            | Arg( config.testsOrTags, "test name|pattern|tags" )
                ( "which test or tests to use" );

        return cli;
    }